

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<Lib::ArrayMapEntry<unsigned_int>_>::DArray
          (DArray<Lib::ArrayMapEntry<unsigned_int>_> *this,size_t size)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ArrayMapEntry<unsigned_int> *p;
  ArrayMapEntry<unsigned_int> *pAVar5;
  long lVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  this->_size = size;
  this->_capacity = size;
  if (size == 0) {
    pAVar5 = (ArrayMapEntry<unsigned_int> *)0x0;
  }
  else {
    uVar7 = size * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar7 < 0x11) {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar7 < 0x19) {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar7 < 0x21) {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar7 < 0x31) {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar7 < 0x41) {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pAVar5 = (ArrayMapEntry<unsigned_int> *)::operator_new(uVar7,0x10);
    }
    auVar4 = _DAT_00871040;
    auVar3 = _DAT_00871030;
    auVar2 = _DAT_00871020;
    sVar1 = this->_capacity;
    if (sVar1 != 0) {
      lVar6 = sVar1 - 1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      uVar7 = 0;
      auVar8 = auVar8 ^ _DAT_00871040;
      do {
        auVar10._8_4_ = (int)uVar7;
        auVar10._0_8_ = uVar7;
        auVar10._12_4_ = (int)(uVar7 >> 0x20);
        auVar11 = (auVar10 | auVar3) ^ auVar4;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          pAVar5[uVar7]._timestamp = 0;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          pAVar5[uVar7 + 1]._timestamp = 0;
        }
        auVar10 = (auVar10 | auVar2) ^ auVar4;
        iVar12 = auVar10._4_4_;
        if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
          pAVar5[uVar7 + 2]._timestamp = 0;
          pAVar5[uVar7 + 3]._timestamp = 0;
        }
        uVar7 = uVar7 + 4;
      } while ((sVar1 + 3 & 0xfffffffffffffffc) != uVar7);
    }
  }
  this->_array = pAVar5;
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }